

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdUtils.c
# Opt level: O3

char * CmdSplitLine(Abc_Frame_t *pAbc,char *sCommand,int *argc,char ***argv)

{
  char *pcVar1;
  bool bVar2;
  bool bVar3;
  uint *__ptr;
  void *pvVar4;
  ushort **ppuVar5;
  long lVar6;
  void *pvVar7;
  char *pcVar8;
  int iVar9;
  char *pcVar10;
  char cVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  int iVar16;
  ulong uVar17;
  
  __ptr = (uint *)malloc(0x10);
  __ptr[0] = 10;
  __ptr[1] = 0;
  pvVar4 = malloc(0x50);
  *(void **)(__ptr + 2) = pvVar4;
  uVar17 = 0;
  uVar15 = 10;
  ppuVar5 = __ctype_b_loc();
LAB_002bfca0:
  do {
    pcVar10 = sCommand;
    uVar12 = (ulong)*pcVar10;
    sCommand = pcVar10 + 1;
  } while ((*(byte *)((long)*ppuVar5 + uVar12 * 2 + 1) & 0x20) != 0);
  lVar14 = 0;
  bVar2 = false;
  bVar3 = false;
  do {
    cVar11 = (char)uVar12;
    if ((cVar11 == '#') || (((uint)uVar12 & 0xff) == 0x3b)) {
LAB_002bfcd7:
      if (!bVar2 && !bVar3) break;
    }
    else {
      if ((uVar12 & 0xff) == 0) goto LAB_002bfd08;
      if ((*(byte *)((long)*ppuVar5 + (long)cVar11 * 2 + 1) & 0x20) != 0) goto LAB_002bfcd7;
    }
    if (cVar11 == '\'') {
      bVar2 = !bVar2;
    }
    if (cVar11 == '\"') {
      bVar3 = !bVar3;
    }
    uVar12 = (ulong)(byte)sCommand[lVar14];
    lVar14 = lVar14 + 1;
  } while( true );
  bVar2 = false;
  bVar3 = false;
LAB_002bfd08:
  if (bVar2 || bVar3) {
    fwrite("** cmd warning: ignoring unbalanced quote ...\n",0x2e,1,(FILE *)pAbc->Err);
  }
  iVar16 = (int)uVar17;
  if (lVar14 == 0) {
    *argc = iVar16;
    *argv = *(char ***)(__ptr + 2);
    free(__ptr);
    if (*pcVar10 == '#') {
      do {
        pcVar8 = pcVar10 + 1;
        pcVar1 = pcVar10 + 1;
        pcVar10 = pcVar8;
      } while (*pcVar1 != '\0');
    }
    else {
      pcVar8 = pcVar10;
      if (*pcVar10 == ';') {
        pcVar8 = sCommand;
      }
    }
    return pcVar8;
  }
  pvVar4 = malloc(lVar14 + 1);
  lVar6 = 0;
  if (0 < lVar14) {
    iVar9 = 0;
    do {
      cVar11 = pcVar10[lVar6];
      if ((cVar11 != '\"') && (cVar11 != '\'')) {
        if (((*ppuVar5)[cVar11] >> 0xd & 1) != 0) {
          cVar11 = ' ';
        }
        lVar13 = (long)iVar9;
        iVar9 = iVar9 + 1;
        *(char *)((long)pvVar4 + lVar13) = cVar11;
      }
      lVar6 = lVar6 + 1;
    } while (lVar14 != lVar6);
    lVar6 = (long)iVar9;
  }
  *(undefined1 *)((long)pvVar4 + lVar6) = 0;
  iVar9 = (int)uVar15;
  if (iVar16 == iVar9) {
    if (iVar9 < 0x10) {
      if (*(void **)(__ptr + 2) == (void *)0x0) {
        pvVar7 = malloc(0x80);
      }
      else {
        pvVar7 = realloc(*(void **)(__ptr + 2),0x80);
      }
      *(void **)(__ptr + 2) = pvVar7;
      *__ptr = 0x10;
      uVar15 = 0x10;
    }
    else {
      uVar15 = (ulong)(uint)(iVar9 * 2);
      if (*(void **)(__ptr + 2) == (void *)0x0) {
        pvVar7 = malloc(uVar15 * 8);
      }
      else {
        pvVar7 = realloc(*(void **)(__ptr + 2),uVar15 * 8);
      }
      *(void **)(__ptr + 2) = pvVar7;
      *__ptr = iVar9 * 2;
    }
  }
  else {
    pvVar7 = *(void **)(__ptr + 2);
  }
  sCommand = sCommand + lVar14 + -1;
  __ptr[1] = iVar16 + 1U;
  *(void **)((long)pvVar7 + uVar17 * 8) = pvVar4;
  uVar17 = (ulong)(iVar16 + 1U);
  goto LAB_002bfca0;
}

Assistant:

const char * CmdSplitLine( Abc_Frame_t * pAbc, const char *sCommand, int *argc, char ***argv )
{
    const char *p, *start;
    char c;
    int i, j;
    char *new_arg;
    Vec_Ptr_t * vArgs;
    int single_quote, double_quote;

    vArgs = Vec_PtrAlloc( 10 );

    p = sCommand;
    for ( ;; )
    {
        // skip leading white space 
        while ( isspace( ( int ) *p ) )
        {
            p++;
        }

        // skip until end of this token 
        single_quote = double_quote = 0;
        for ( start = p; ( c = *p ) != '\0'; p++ )
        {
            if ( c == ';' || c == '#' || isspace( ( int ) c ) )
            {
                if ( !single_quote && !double_quote )
                {
                    break;
                }
            }
            if ( c == '\'' )
            {
                single_quote = !single_quote;
            }
            if ( c == '"' )
            {
                double_quote = !double_quote;
            }
        }
        if ( single_quote || double_quote )
        {
            ( void ) fprintf( pAbc->Err, "** cmd warning: ignoring unbalanced quote ...\n" );
        }
        if ( start == p )
            break;

        new_arg = ABC_ALLOC( char, p - start + 1 );
        j = 0;
        for ( i = 0; i < p - start; i++ )
        {
            c = start[i];
            if ( ( c != '\'' ) && ( c != '\"' ) )
            {
                new_arg[j++] = isspace( ( int ) c ) ? ' ' : start[i];
            }
        }
        new_arg[j] = '\0';
        Vec_PtrPush( vArgs, new_arg );
    }

    *argc = vArgs->nSize;
    *argv = (char **)Vec_PtrReleaseArray( vArgs );
    Vec_PtrFree( vArgs );
    if ( *p == ';' )
    {
        p++;
    }
    else if ( *p == '#' )
    {
        for ( ; *p != 0; p++ ); // skip to end of line 
    }
    return p;
}